

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_sig.c
# Opt level: O0

int rsa_digest_signverify_init
              (void *vprsactx,char *mdname,void *vrsa,OSSL_PARAM *params,int operation)

{
  int iVar1;
  EVP_MD_CTX *pEVar2;
  char *in_RCX;
  char *in_RDX;
  PROV_RSA_CTX_conflict1 *in_RSI;
  EVP_MD *in_RDI;
  undefined4 in_R8D;
  PROV_RSA_CTX_conflict1 *prsactx;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffffd0;
  
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = rsa_signverify_init(vrsa,params,(OSSL_PARAM *)CONCAT44(operation,in_stack_00000008),
                              prsactx._4_4_);
  if (iVar1 == 0) {
    return 0;
  }
  if ((in_RSI != (PROV_RSA_CTX_conflict1 *)0x0) &&
     (((*(char *)&in_RSI->libctx == '\0' ||
       (iVar1 = strcasecmp((char *)((long)&in_RDI->final + 4),(char *)in_RSI), iVar1 != 0)) &&
      (iVar1 = rsa_setup_md(in_RSI,in_RDX,in_RCX), iVar1 == 0)))) {
    return 0;
  }
  in_RDI->field_0x1c = in_RDI->field_0x1c & 0xfe;
  if (in_RDI->update == (_func_int_EVP_MD_CTX_ptr_void_ptr_size_t *)0x0) {
    pEVar2 = EVP_MD_CTX_new();
    in_RDI->update = (_func_int_EVP_MD_CTX_ptr_void_ptr_size_t *)pEVar2;
    if (in_RDI->update == (_func_int_EVP_MD_CTX_ptr_void_ptr_size_t *)0x0) goto LAB_0034a790;
  }
  iVar1 = EVP_DigestInit_ex2((EVP_MD_CTX *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),in_RDI,
                             (OSSL_PARAM *)0x34a77f);
  if (iVar1 != 0) {
    return 1;
  }
LAB_0034a790:
  EVP_MD_CTX_free((EVP_MD_CTX *)0x34a79d);
  in_RDI->update = (_func_int_EVP_MD_CTX_ptr_void_ptr_size_t *)0x0;
  return 0;
}

Assistant:

static int rsa_digest_signverify_init(void *vprsactx, const char *mdname,
                                      void *vrsa, const OSSL_PARAM params[],
                                      int operation)
{
    PROV_RSA_CTX *prsactx = (PROV_RSA_CTX *)vprsactx;

    if (!ossl_prov_is_running())
        return 0;

    if (!rsa_signverify_init(vprsactx, vrsa, params, operation))
        return 0;

    if (mdname != NULL
        /* was rsa_setup_md already called in rsa_signverify_init()? */
        && (mdname[0] == '\0' || strcasecmp(prsactx->mdname, mdname) != 0)
        && !rsa_setup_md(prsactx, mdname, prsactx->propq))
        return 0;

    prsactx->flag_allow_md = 0;

    if (prsactx->mdctx == NULL) {
        prsactx->mdctx = EVP_MD_CTX_new();
        if (prsactx->mdctx == NULL)
            goto error;
    }

    if (!EVP_DigestInit_ex2(prsactx->mdctx, prsactx->md, params))
        goto error;

    return 1;

 error:
    EVP_MD_CTX_free(prsactx->mdctx);
    prsactx->mdctx = NULL;
    return 0;
}